

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O3

_Bool tableSet(Table *table,ObjString *key,Value value)

{
  Value *pVVar1;
  ObjString *pOVar2;
  bool bVar3;
  _Bool _Var4;
  uint uVar5;
  Entry *pEVar6;
  size_t sVar7;
  Entry *pEVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint32_t uVar13;
  Entry *pEVar14;
  size_t newSize;
  Entry *pEVar15;
  
  uVar10 = table->capacity;
  iVar9 = uVar10 + 1;
  if ((double)(table->count + 1) <= (double)iVar9 * 0.75) {
    pEVar6 = table->entries;
  }
  else {
    bVar3 = 6 < (int)uVar10;
    uVar10 = 7;
    if (bVar3) {
      uVar10 = iVar9 * 2 - 1;
    }
    newSize = (ulong)(uVar10 + 1) << 4;
    pEVar6 = (Entry *)reallocate((void *)0x0,0,newSize);
    if (-1 < (int)uVar10) {
      sVar7 = 0;
      do {
        *(undefined8 *)((long)&pEVar6->key + sVar7) = 0;
        *(undefined8 *)((long)&pEVar6->value + sVar7) = 0x7ffc000000000001;
        sVar7 = sVar7 + 0x10;
      } while (newSize != sVar7);
    }
    table->count = 0;
    uVar5 = table->capacity + 1;
    pEVar8 = table->entries;
    if (-1 < table->capacity) {
      iVar9 = 0;
      uVar11 = 0;
LAB_00106945:
      pOVar2 = pEVar8[uVar11].key;
      if (pOVar2 != (ObjString *)0x0) {
        uVar13 = pOVar2->hash;
        pEVar14 = (Entry *)0x0;
        do {
          uVar12 = uVar13 & uVar10;
          pEVar15 = pEVar6 + uVar12;
          if (pEVar6[uVar12].key == (ObjString *)0x0) {
            if (pEVar14 == (Entry *)0x0) {
              pEVar14 = pEVar15;
            }
            pVVar1 = &pEVar15->value;
            pEVar15 = pEVar14;
            if (*pVVar1 == 0x7ffc000000000001) goto LAB_00106992;
          }
          else if (pEVar6[uVar12].key == pOVar2) goto LAB_00106992;
          uVar13 = uVar12 + 1;
        } while( true );
      }
      goto LAB_001069a3;
    }
LAB_001069ab:
    reallocate(pEVar8,(long)(int)uVar5 << 4,0);
    table->entries = pEVar6;
    table->capacity = uVar10;
  }
  uVar5 = key->hash;
  pEVar8 = (Entry *)0x0;
  do {
    uVar5 = uVar5 & uVar10;
    pEVar14 = pEVar6 + uVar5;
    if (pEVar6[uVar5].key == (ObjString *)0x0) {
      if (pEVar8 == (Entry *)0x0) {
        pEVar8 = pEVar14;
      }
      if (pEVar14->value == 0x7ffc000000000001) {
        if (pEVar8->key == (ObjString *)0x0) {
          _Var4 = true;
          if (pEVar8->value == 0x7ffc000000000001) {
            table->count = table->count + 1;
          }
        }
        else {
          _Var4 = false;
        }
        goto LAB_00106a1e;
      }
    }
    else if (pEVar6[uVar5].key == key) {
      _Var4 = false;
      pEVar8 = pEVar14;
LAB_00106a1e:
      pEVar8->key = key;
      pEVar8->value = value;
      return _Var4;
    }
    uVar5 = uVar5 + 1;
  } while( true );
LAB_00106992:
  pEVar15->key = pOVar2;
  pEVar15->value = pEVar8[uVar11].value;
  iVar9 = iVar9 + 1;
  table->count = iVar9;
LAB_001069a3:
  uVar11 = uVar11 + 1;
  if (uVar11 == uVar5) goto LAB_001069ab;
  goto LAB_00106945;
}

Assistant:

bool tableSet(Table *table, ObjString *key, Value value) {
    //grow when the array becomes at least 75% full.
    if (table->count + 1 > (table->capacity + 1) * TABLE_MAX_LOAD) {
        int capacity = GROW_CAPACITY(table->capacity + 1) - 1;
        adjustCapacity(table, capacity);
    }

    Entry *entry = findEntry(table->entries, table->capacity, key);
    bool isNewKey = entry->key == NULL;

    //The count is no longer the number of entries in the hash table,
    // it’s the number of entries plus tombstones
    if (isNewKey && IS_NIL(entry->value)) table->count++;

    entry->key = key;
    entry->value = value;
    return isNewKey;
}